

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeSwitch(TranslateToFuzzReader *this,Type type)

{
  Id IVar1;
  string_view default_;
  value_type *ppEVar2;
  uintptr_t uVar3;
  Switch *pSVar4;
  Expression *pEVar5;
  Expression *value;
  TranslateToFuzzReader *this_00;
  int iVar6;
  Type TVar7;
  bool bVar8;
  undefined1 auStack_60 [8];
  Name name;
  undefined1 auStack_48 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> names;
  
  if (type.id != 1) {
    __assert_fail("type == Type::unreachable",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x10eb,"Expression *wasm::TranslateToFuzzReader::makeSwitch(Type)");
  }
  if ((this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar6 = (this->fuzzParams->super_FuzzParams).TRIES;
    auStack_48 = (undefined1  [8])0x0;
    names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    name.super_IString.str._M_str = (char *)0x1;
    if (iVar6 < 1) {
      TVar7.id = 1;
    }
    else {
      iVar6 = iVar6 + 1;
      TVar7.id = 1;
      do {
        this_00 = (TranslateToFuzzReader *)&this->random;
        ppEVar2 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                            (&this->random,&this->funcContext->breakableStack);
        pEVar5 = *ppEVar2;
        _auStack_60 = (string_view)getTargetName(this_00,pEVar5);
        IVar1 = pEVar5->_id;
        if (IVar1 != BlockId) {
          uVar3 = 0;
        }
        else {
          uVar3 = (pEVar5->type).id;
        }
        if (IVar1 != BlockId && IVar1 != LoopId) {
          wasm::handle_unreachable
                    ("unexpected expr type",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                     ,0x15f4);
        }
        if ((auStack_48 ==
             (undefined1  [8])
             names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start) ||
           (bVar8 = TVar7.id == uVar3, uVar3 = TVar7.id, bVar8)) {
          TVar7.id = uVar3;
          if (names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start ==
              names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                      ((vector<wasm::Name,std::allocator<wasm::Name>> *)auStack_48,
                       (iterator)
                       names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                       super__Vector_impl_data._M_start,(Name *)auStack_60);
          }
          else {
            ((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start)->super_IString).str._M_len = (size_t)auStack_60;
            ((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start)->super_IString).str._M_str =
                 (char *)name.super_IString.str._M_len;
            names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start =
                 names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          }
        }
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
    }
    if ((ulong)((long)names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                      super__Vector_impl_data._M_start - (long)auStack_48) < 0x11) {
      pSVar4 = (Switch *)make(this,(Type)name.super_IString.str._M_str);
    }
    else {
      default_ = names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_start[-1].super_IString.str;
      names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start =
           names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_start + -1;
      pEVar5 = make(this,(Type)0x2);
      if (TVar7.id < 2) {
        value = (Expression *)0x0;
      }
      else {
        value = make(this,TVar7);
      }
      pSVar4 = Builder::makeSwitch<std::vector<wasm::Name,std::allocator<wasm::Name>>>
                         (&this->builder,
                          (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_48,
                          (Name)default_,pEVar5,value);
    }
    if (auStack_48 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_48,
                      (long)names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
    }
    return (Expression *)pSVar4;
  }
  pEVar5 = make(this,(Type)0x1);
  return pEVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makeSwitch(Type type) {
  assert(type == Type::unreachable);
  if (funcContext->breakableStack.empty()) {
    return make(type);
  }
  // we need to find proper targets to break to; try a bunch
  int tries = fuzzParams->TRIES;
  std::vector<Name> names;
  Type valueType = Type::unreachable;
  while (tries-- > 0) {
    auto* target = pick(funcContext->breakableStack);
    auto name = getTargetName(target);
    auto currValueType = getTargetType(target);
    if (names.empty()) {
      valueType = currValueType;
    } else {
      if (valueType != currValueType) {
        continue; // all values must be the same
      }
    }
    names.push_back(name);
  }
  if (names.size() < 2) {
    // we failed to find enough
    return make(type);
  }
  auto default_ = names.back();
  names.pop_back();
  auto temp1 = make(Type::i32),
       temp2 = valueType.isConcrete() ? make(valueType) : nullptr;
  return builder.makeSwitch(names, default_, temp1, temp2);
}